

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void __thiscall pg::FPISolver::run_par(FPISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ostream *this_00;
  bool bVar8;
  int local_54;
  undefined1 local_50 [4];
  int p;
  uint local_40;
  int local_3c;
  int p_1;
  int v;
  int *p_len;
  int *p_start;
  Task *pTStack_20;
  int d;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  FPISolver *this_local;
  
  pTStack_20 = __lace_dq_head;
  __lace_dq_head_local = (Task *)__lace_worker;
  __lace_worker_local = (WorkerP *)this;
  lVar5 = Solver::nodecount(&this->super_Solver);
  p_start._4_4_ = Solver::priority(&this->super_Solver,(int)lVar5 + -1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(p_start._4_4_ + 1);
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  p_len = (int *)operator_new__(uVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(p_start._4_4_ + 1);
  uVar6 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  _p_1 = operator_new__(uVar6);
  local_3c = 0;
  for (local_40 = 0; (int)local_40 <= p_start._4_4_; local_40 = local_40 + 1) {
    uVar3 = Solver::priority(&this->super_Solver,local_3c);
    if (uVar3 == local_40) {
      p_len[(int)local_40] = local_3c;
      while( true ) {
        lVar5 = (long)local_3c;
        lVar7 = Solver::nodecount(&this->super_Solver);
        bVar8 = false;
        if (lVar5 < lVar7) {
          uVar3 = Solver::priority(&this->super_Solver,local_3c);
          bVar8 = uVar3 == local_40;
        }
        if (!bVar8) break;
        uVar3 = local_40 & 1;
        bitset::operator[]((bitset *)local_50,(size_t)&this->parity);
        bitset::reference::operator=((reference *)local_50,uVar3 != 0);
        local_3c = local_3c + 1;
      }
      *(int *)((long)_p_1 + (long)(int)local_40 * 4) = local_3c - p_len[(int)local_40];
    }
    else {
      p_len[(int)local_40] = -1;
      *(undefined4 *)((long)_p_1 + (long)(int)local_40 * 4) = 0;
    }
  }
  this->iterations = 1;
  local_54 = 0;
  while (local_54 <= p_start._4_4_) {
    if (*(int *)((long)_p_1 + (long)local_54 * 4) == 0) {
      local_54 = local_54 + 1;
    }
    else {
      iVar4 = update_block_rec_CALL
                        ((WorkerP *)__lace_dq_head_local,pTStack_20,this,p_len[local_54],
                         *(int *)((long)_p_1 + (long)local_54 * 4));
      if (iVar4 == 0) {
        local_54 = local_54 + 1;
      }
      else {
        if (local_54 != 0) {
          freeze_thaw_reset_rec_CALL
                    ((WorkerP *)__lace_dq_head_local,pTStack_20,this,0,p_len[local_54],local_54);
          local_54 = 0;
        }
        this->iterations = this->iterations + 1;
        if (1 < (this->super_Solver).trace) {
          this_00 = std::operator<<((this->super_Solver).logger,
                                    "restarting after finding distractions");
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  if (p_len != (int *)0x0) {
    operator_delete__(p_len);
  }
  if (_p_1 != (void *)0x0) {
    operator_delete__(_p_1);
  }
  return;
}

Assistant:

void
FPISolver::run_par(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    int d = this->priority(this->nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];

    // initialize p_start, p_len, parity
    {
        int v=0;
        for (int p=0; p<=d; p++) {
            if (this->priority(v) == p) {
                p_start[p] = v;
                while (v < this->nodecount() and this->priority(v) == p) {
                    this->parity[v] = p&1;
                    v++;
                }
                p_len[p] = v - p_start[p];
            } else {
                p_start[p] = -1;
                p_len[p] = 0;
            }
        }
    }

    this->iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0) {
            p++;
        } else if (CALL(update_block_rec, this, p_start[p], p_len[p])) {
            // something changed, freeze and reset
            if (p != 0) {
                CALL(freeze_thaw_reset_rec, this, 0, p_start[p], p);
                p = 0;
            }
            this->iterations++;
#ifndef NDEBUG
            if (this->trace >= 2) this->logger << "restarting after finding distractions" << std::endl;
#endif
        } else {
            // nothing changed
            p++;
        }
    }

    delete[] p_start;
    delete[] p_len;
}